

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_ary_search_set.hpp
# Opt level: O3

const_iterator __thiscall
burst::k_ary_search_set<long,_std::less<void>_>::find_impl
          (k_ary_search_set<long,_std::less<void>_> *this,value_type_conflict2 *value)

{
  ulong uVar1;
  long *plVar2;
  pointer plVar3;
  long *plVar4;
  long *plVar5;
  const_iterator cVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  plVar3 = (this->m_values).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  plVar4 = (this->m_values).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar7 = (long)plVar4 - (long)plVar3;
  cVar6._M_current = plVar4;
  if (lVar7 != 0) {
    uVar1 = this->m_arity - 1;
    uVar10 = 0;
    do {
      plVar2 = plVar3 + uVar10;
      uVar8 = (long)plVar4 - (long)plVar2 >> 3;
      plVar5 = plVar2;
      uVar9 = uVar8;
      if ((long)uVar1 <= (long)uVar8) {
        uVar8 = uVar1;
        uVar9 = uVar1;
      }
      while (cVar6._M_current = plVar5, 0 < (long)uVar8) {
        uVar11 = uVar8 >> 1;
        uVar8 = ~uVar11 + uVar8;
        plVar5 = cVar6._M_current + uVar11 + 1;
        if (*value <= cVar6._M_current[uVar11]) {
          plVar5 = cVar6._M_current;
          uVar8 = uVar11;
        }
      }
    } while (((cVar6._M_current == plVar2 + uVar9) || (*value < *cVar6._M_current)) &&
            (uVar10 = uVar10 * this->m_arity +
                      (((long)cVar6._M_current - (long)plVar2 >> 3) + 1) * uVar1,
            cVar6._M_current = plVar4, uVar10 < (ulong)(lVar7 >> 3)));
  }
  return (const_iterator)cVar6._M_current;
}

Assistant:

const_iterator find_impl (const value_type & value) const
        {
            std::size_t node_index = 0;

            while (node_index < m_values.size())
            {
                const_iterator node_begin = begin() + static_cast<difference_type>(node_index);
                const_iterator node_end =
                    node_begin +
                    std::min
                    (
                        static_cast<difference_type>(m_arity - 1),
                        std::distance(node_begin, end())
                    );

                const_iterator search_result =
                    std::lower_bound(node_begin, node_end, value, m_compare);
                if (search_result != node_end && not m_compare(value, *search_result))
                {
                    return search_result;
                }
                else
                {
                    node_index = perfect_tree_child_index
                    (
                        m_arity,
                        node_index,
                        static_cast<std::size_t>(std::distance(node_begin, search_result))
                    );
                }
            }

            return end();
        }